

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedPumpFrom::pumpTo
          (BlockedPumpFrom *this,AsyncOutputStream *output,uint64_t amount2)

{
  TransformPromiseNodeBase *this_00;
  PromiseNode *in_RCX;
  PromiseNode *extraout_RDX;
  PromiseNode *pPVar1;
  Promise<unsigned_long> PVar2;
  Own<kj::_::PromiseNode> local_80;
  Fault f;
  Own<kj::_::PromiseNode> local_60;
  Own<kj::_::PromiseNode> local_50;
  Own<kj::_::PromiseNode> local_40;
  
  if (output[7]._vptr_AsyncOutputStream == (_func_int **)0x0) {
    pPVar1 = (PromiseNode *)
             ((long)output[5]._vptr_AsyncOutputStream - (long)output[6]._vptr_AsyncOutputStream);
    if (in_RCX < pPVar1) {
      pPVar1 = in_RCX;
    }
    (**(code **)(*output[4]._vptr_AsyncOutputStream + 0x18))
              (&local_60,output[4]._vptr_AsyncOutputStream,amount2,pPVar1);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_60,
               kj::_::
               TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:531:17),_kj::_::PropagateException>
               ::anon_class_32_4_39723cd8_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00679ff8;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)output;
    this_00[1].dependency.disposer = (Disposer *)amount2;
    this_00[1].dependency.ptr = in_RCX;
    this_00[1].continuationTracePtr = pPVar1;
    f.exception = (Exception *)
                  &kj::_::
                   HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
                   ::instance;
    kj::_::maybeChain<unsigned_long>(&local_50,(Promise<unsigned_long> *)&f);
    pPVar1 = local_50.ptr;
    local_40.disposer = local_50.disposer;
    local_50.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_50);
    local_80.disposer = local_50.disposer;
    local_80.ptr = pPVar1;
    local_40.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_40);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
    newAdaptedPromise<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>,kj::Canceler&,kj::Promise<unsigned_long>>
              ((kj *)this,(Canceler *)(output + 7),(Promise<unsigned_long> *)&local_80);
    Own<kj::_::PromiseNode>::dispose(&local_80);
    Own<kj::_::PromiseNode>::dispose(&local_60);
    PVar2.super_PromiseBase.node.ptr = extraout_RDX;
    PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
    return (Promise<unsigned_long>)PVar2.super_PromiseBase.node;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x20f,FAILED,"canceler.isEmpty()","\"already pumping\"",
             (char (*) [16])"already pumping");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

KJ_IF_MAYBE(reason, stoppage) {
        if (reason->is<Eof>()) {
          return uint64_t(0);
        }
        return cp(reason->get<Exception>());
      }